

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeTypes(WasmBinaryWriter *this)

{
  bool bVar1;
  __optional_ne_t<wasm::RecGroup,_wasm::RecGroup> _Var2;
  HeapTypeKind HVar3;
  size_type sVar4;
  reference pHVar5;
  mapped_type *pmVar6;
  reference pvVar7;
  size_t sVar8;
  BufferWithRandomAccess *pBVar9;
  HeapType *pHVar10;
  Type *pTVar11;
  Struct *__x;
  HeapType type_00;
  reference rVar12;
  optional<wasm::HeapType> oVar13;
  Signature SVar14;
  Iterator IVar15;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar16;
  Field local_240;
  reference local_230;
  Field *field;
  iterator __end4_1;
  iterator __begin4_1;
  FieldList *__range4_1;
  undefined1 local_208 [8];
  FieldList fields;
  Type *type_3;
  Iterator __end5;
  Iterator __begin5;
  Type *__range5;
  Type *local_1b0;
  Type *sigType;
  const_iterator __end4;
  const_iterator __begin4;
  uintptr_t local_190;
  initializer_list<wasm::Type> local_188;
  initializer_list<wasm::Type> *local_178;
  initializer_list<wasm::Type> *__range4;
  Signature sig;
  _Storage<wasm::HeapType,_true> local_158;
  optional<wasm::HeapType> desc_1;
  _Storage<wasm::HeapType,_true> local_140;
  optional<wasm::HeapType> desc;
  U32LEB local_11c;
  _Storage<wasm::HeapType,_true> local_118;
  optional<wasm::HeapType> super_1;
  RecGroup local_100;
  RecGroup currGroup_1;
  value_type type_2;
  Index i;
  optional<wasm::RecGroup> lastGroup;
  undefined1 auStack_d0 [4];
  int32_t start;
  _Bit_type local_c8;
  _Storage<wasm::HeapType,_true> local_c0;
  optional<wasm::HeapType> super;
  HeapType type_1;
  iterator __end1;
  iterator __begin1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1;
  allocator<bool> local_79;
  undefined1 local_78 [8];
  vector<bool,_std::allocator<bool>_> hasSubtypes;
  RecGroup currGroup;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  optional<wasm::RecGroup> lastGroup_1;
  size_t numGroups;
  WasmBinaryWriter *this_local;
  
  sVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                    (&(this->indexedTypes).types);
  if (sVar4 != 0) {
    lastGroup_1.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::RecGroup>._M_engaged = false;
    lastGroup_1.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::RecGroup>._9_7_ = 0;
    std::optional<wasm::RecGroup>::optional((optional<wasm::RecGroup> *)&__range2);
    __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       (&(this->indexedTypes).types);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        (&(this->indexedTypes).types);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&type), bVar1) {
      pHVar5 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end2);
      currGroup.id = pHVar5->id;
      hasSubtypes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)HeapType::getRecGroup((HeapType *)&currGroup);
      _Var2 = std::operator!=((optional<wasm::RecGroup> *)&__range2,
                              (RecGroup *)
                              &hasSubtypes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage);
      lastGroup_1.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::RecGroup>._8_8_ =
           (ulong)_Var2 +
           lastGroup_1.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::RecGroup>._8_8_;
      std::optional<wasm::RecGroup>::operator=
                ((optional<wasm::RecGroup> *)&__range2,
                 (RecGroup *)
                 &hasSubtypes.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end2);
    }
    sVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      (&(this->indexedTypes).types);
    std::allocator<bool>::allocator(&local_79);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_78,sVar4,&local_79);
    std::allocator<bool>::~allocator(&local_79);
    __end1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       (&(this->indexedTypes).types);
    type_1.id = (uintptr_t)
                std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                          (&(this->indexedTypes).types);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                  *)&type_1);
      if (!bVar1) break;
      pHVar5 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end1);
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar5->id;
      oVar13 = HeapType::getDeclaredSuperType
                         ((HeapType *)
                          &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_engaged);
      local_c0 = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
           oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_c0._M_value);
      if (bVar1) {
        pHVar10 = std::optional<wasm::HeapType>::operator*
                            ((optional<wasm::HeapType> *)&local_c0._M_value);
        pmVar6 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[](&(this->indexedTypes).indices,pHVar10);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_78,(ulong)*pmVar6);
        _auStack_d0 = rVar12;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_d0,true);
      }
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end1);
    }
    lastGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::RecGroup>._12_4_ =
         startSection<wasm::BinaryConsts::Section>(this,Type);
    pBVar9 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)
               &lastGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::RecGroup>._M_engaged,
               lastGroup_1.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::RecGroup>._8_4_);
    BufferWithRandomAccess::operator<<
              (pBVar9,(U32LEB)lastGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::RecGroup>._8_4_);
    std::optional<wasm::RecGroup>::optional((optional<wasm::RecGroup> *)&i);
    type_2.id._0_4_ = 0;
    while( true ) {
      sVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                        (&(this->indexedTypes).types);
      if (sVar4 <= (uint)type_2.id) break;
      pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&(this->indexedTypes).types,(ulong)(uint)type_2.id);
      currGroup_1.id = pvVar7->id;
      local_100 = HeapType::getRecGroup((HeapType *)&currGroup_1);
      _Var2 = std::operator!=((optional<wasm::RecGroup> *)&i,&local_100);
      if (_Var2) {
        sVar8 = RecGroup::size(&local_100);
        if (1 < sVar8) {
          pBVar9 = BufferWithRandomAccess::operator<<(this->o,'N');
          sVar8 = RecGroup::size(&local_100);
          LEB<unsigned_int,_unsigned_char>::LEB
                    ((LEB<unsigned_int,_unsigned_char> *)
                     &super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>.field_0xc,(uint)sVar8);
          BufferWithRandomAccess::operator<<
                    (pBVar9,(U32LEB)super_1.super__Optional_base<wasm::HeapType,_true,_true>.
                                    _M_payload.super__Optional_payload_base<wasm::HeapType>._12_4_);
        }
      }
      std::optional<wasm::RecGroup>::operator=((optional<wasm::RecGroup> *)&i,&local_100);
      oVar13 = HeapType::getDeclaredSuperType((HeapType *)&currGroup_1);
      local_118 = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload;
      super_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
           oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_118._M_value);
      if (bVar1) {
LAB_025b8c74:
        bVar1 = HeapType::isOpen((HeapType *)&currGroup_1);
        if (bVar1) {
          BufferWithRandomAccess::operator<<(this->o,'P');
        }
        else {
          BufferWithRandomAccess::operator<<(this->o,'O');
        }
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_118._M_value);
        if (bVar1) {
          pBVar9 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB(&local_11c,1);
          BufferWithRandomAccess::operator<<(pBVar9,local_11c);
          pHVar10 = std::optional<wasm::HeapType>::operator*
                              ((optional<wasm::HeapType> *)&local_118._M_value);
          writeHeapType(this,(HeapType)pHVar10->id,Inexact);
        }
        else {
          pBVar9 = this->o;
          LEB<unsigned_int,_unsigned_char>::LEB
                    ((LEB<unsigned_int,_unsigned_char> *)
                     &desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>.field_0xc,0);
          BufferWithRandomAccess::operator<<
                    (pBVar9,(U32LEB)desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload
                                    .super__Optional_payload_base<wasm::HeapType>._12_4_);
        }
      }
      else {
        bVar1 = HeapType::isOpen((HeapType *)&currGroup_1);
        if (bVar1) goto LAB_025b8c74;
      }
      bVar1 = HeapType::isShared((HeapType *)&currGroup_1);
      if (bVar1) {
        BufferWithRandomAccess::operator<<(this->o,'e');
      }
      oVar13 = HeapType::getDescribedType((HeapType *)&currGroup_1);
      local_140 = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload;
      desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
           oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_140._M_value);
      if (bVar1) {
        BufferWithRandomAccess::operator<<(this->o,'L');
        pHVar10 = std::optional<wasm::HeapType>::operator*
                            ((optional<wasm::HeapType> *)&local_140._M_value);
        desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar10->id;
        writeHeapType(this,(HeapType)
                           desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._8_8_,Inexact);
      }
      oVar13 = HeapType::getDescriptorType((HeapType *)&currGroup_1);
      local_158 = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_payload;
      desc_1.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
           oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_158._M_value);
      if (bVar1) {
        BufferWithRandomAccess::operator<<(this->o,'M');
        pHVar10 = std::optional<wasm::HeapType>::operator*
                            ((optional<wasm::HeapType> *)&local_158._M_value);
        sig.results.id = pHVar10->id;
        writeHeapType(this,(HeapType)sig.results.id,Inexact);
      }
      HVar3 = HeapType::getKind((HeapType *)&currGroup_1);
      switch(HVar3) {
      case Basic:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x148);
      case Func:
        BufferWithRandomAccess::operator<<(this->o,'`');
        SVar14 = HeapType::getSignature((HeapType *)&currGroup_1);
        local_190 = (uintptr_t)SVar14.results.id;
        __begin4 = (const_iterator)SVar14.params.id;
        local_188._M_array = (iterator)&__begin4;
        local_188._M_len = 2;
        local_178 = &local_188;
        __range4 = (initializer_list<wasm::Type> *)__begin4;
        sig.params.id = local_190;
        __end4 = std::initializer_list<wasm::Type>::begin(local_178);
        sigType = std::initializer_list<wasm::Type>::end(local_178);
        for (; __end4 != sigType; __end4 = __end4 + 1) {
          local_1b0 = __end4;
          pBVar9 = this->o;
          sVar8 = wasm::Type::size(__end4);
          LEB<unsigned_int,_unsigned_char>::LEB
                    ((LEB<unsigned_int,_unsigned_char> *)((long)&__range5 + 4),(uint)sVar8);
          BufferWithRandomAccess::operator<<(pBVar9,__range5._4_4_);
          pTVar11 = local_1b0;
          IVar15 = wasm::Type::begin(local_1b0);
          __end5.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)IVar15.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent;
          PVar16 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   wasm::Type::end(pTVar11);
          while( true ) {
            __end5.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)PVar16.index;
            type_3 = PVar16.parent;
            bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                               &__end5.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       *)&type_3);
            if (!bVar1) break;
            pTVar11 = wasm::Type::Iterator::operator*
                                ((Iterator *)
                                 &__end5.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index);
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)pTVar11->id;
            writeType(this,(Type)fields.
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end5.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index);
            PVar16.index = (size_t)__end5.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent;
            PVar16.parent = type_3;
          }
        }
        break;
      case Struct:
        BufferWithRandomAccess::operator<<(this->o,'_');
        __x = HeapType::getStruct((HeapType *)&currGroup_1);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_208,&__x->fields);
        pBVar9 = this->o;
        sVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                          ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_208);
        LEB<unsigned_int,_unsigned_char>::LEB
                  ((LEB<unsigned_int,_unsigned_char> *)((long)&__range4_1 + 4),(uint)sVar4);
        BufferWithRandomAccess::operator<<(pBVar9,__range4_1._4_4_);
        __end4_1 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin
                             ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_208);
        field = (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end
                                   ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_208);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end4_1,
                             (__normal_iterator<wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                              *)&field);
          if (!bVar1) break;
          local_230 = __gnu_cxx::
                      __normal_iterator<wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                      ::operator*(&__end4_1);
          writeField(this,local_230);
          __gnu_cxx::
          __normal_iterator<wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
          ::operator++(&__end4_1);
        }
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_208);
        break;
      case Array:
        BufferWithRandomAccess::operator<<(this->o,'^');
        HeapType::getArray((HeapType *)&local_240);
        writeField(this,&local_240);
        break;
      case Cont:
        BufferWithRandomAccess::operator<<(this->o,']');
        type_00.id = (uintptr_t)HeapType::getContinuation((HeapType *)&currGroup_1);
        writeHeapType(this,type_00,Inexact);
      }
      type_2.id._0_4_ = (uint)type_2.id + 1;
    }
    finishSection(this,lastGroup.super__Optional_base<wasm::RecGroup,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::RecGroup>._12_4_);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_78);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeTypes() {
  if (indexedTypes.types.size() == 0) {
    return;
  }
  // Count the number of recursion groups, which is the number of elements in
  // the type section.
  size_t numGroups = 0;
  {
    std::optional<RecGroup> lastGroup;
    for (auto type : indexedTypes.types) {
      auto currGroup = type.getRecGroup();
      numGroups += lastGroup != currGroup;
      lastGroup = currGroup;
    }
  }

  // As a temporary measure, detect which types have subtypes and always use
  // `sub` or `sub final` for these types. The standard says that types without
  // `sub` or `sub final` are final, but we currently treat them as non-final.
  // To avoid unsafe ambiguity, only use the short form for types that it would
  // be safe to treat as final, i.e. types without subtypes.
  std::vector<bool> hasSubtypes(indexedTypes.types.size());
  for (auto type : indexedTypes.types) {
    if (auto super = type.getDeclaredSuperType()) {
      hasSubtypes[indexedTypes.indices[*super]] = true;
    }
  }

  auto start = startSection(BinaryConsts::Section::Type);
  o << U32LEB(numGroups);
  std::optional<RecGroup> lastGroup = std::nullopt;
  for (Index i = 0; i < indexedTypes.types.size(); ++i) {
    auto type = indexedTypes.types[i];
    // Check whether we need to start a new recursion group. Recursion groups of
    // size 1 are implicit, so only emit a group header for larger groups.
    auto currGroup = type.getRecGroup();
    if (lastGroup != currGroup && currGroup.size() > 1) {
      o << uint8_t(BinaryConsts::EncodedType::Rec) << U32LEB(currGroup.size());
    }
    lastGroup = currGroup;
    // Emit the type definition.
    auto super = type.getDeclaredSuperType();
    if (super || type.isOpen()) {
      if (type.isOpen()) {
        o << uint8_t(BinaryConsts::EncodedType::Sub);
      } else {
        o << uint8_t(BinaryConsts::EncodedType::SubFinal);
      }
      if (super) {
        o << U32LEB(1);
        writeHeapType(*super, Inexact);
      } else {
        o << U32LEB(0);
      }
    }
    if (type.isShared()) {
      o << uint8_t(BinaryConsts::EncodedType::Shared);
    }
    if (auto desc = type.getDescribedType()) {
      o << uint8_t(BinaryConsts::EncodedType::Describes);
      writeHeapType(*desc, Inexact);
    }
    if (auto desc = type.getDescriptorType()) {
      o << uint8_t(BinaryConsts::EncodedType::Descriptor);
      writeHeapType(*desc, Inexact);
    }
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        o << uint8_t(BinaryConsts::EncodedType::Func);
        auto sig = type.getSignature();
        for (auto& sigType : {sig.params, sig.results}) {
          o << U32LEB(sigType.size());
          for (const auto& type : sigType) {
            writeType(type);
          }
        }
        break;
      }
      case HeapTypeKind::Struct: {
        o << uint8_t(BinaryConsts::EncodedType::Struct);
        auto fields = type.getStruct().fields;
        o << U32LEB(fields.size());
        for (const auto& field : fields) {
          writeField(field);
        }
        break;
      }
      case HeapTypeKind::Array:
        o << uint8_t(BinaryConsts::EncodedType::Array);
        writeField(type.getArray().element);
        break;
      case HeapTypeKind::Cont:
        o << uint8_t(BinaryConsts::EncodedType::Cont);
        writeHeapType(type.getContinuation().type, Inexact);
        break;
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }
  finishSection(start);
}